

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_EmbeddedFullDeletionTest_Test::TestBody
          (ComparisonTest_EmbeddedFullDeletionTest_Test *this)

{
  anon_union_816_1_493b367e_for_TestAllTypes_11 *paVar1;
  TestAllTypes_NestedMessage *this_00;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38;
  
  this_00 = (this->super_ComparisonTest).proto2_.field_0._impl_.optional_nested_message_;
  if (this_00 != (TestAllTypes_NestedMessage *)0x0) {
    proto2_unittest::TestAllTypes_NestedMessage::Clear(this_00);
  }
  paVar1 = &(this->super_ComparisonTest).proto2_.field_0;
  *(byte *)paVar1 = *(byte *)paVar1 & 0xdf;
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_38,this,&(this->super_ComparisonTest).proto1_.super_Message,
             &(this->super_ComparisonTest).proto2_.super_Message);
  testing::internal::CmpHelperEQ<char[47],std::__cxx11::string>
            (local_48,"\"deleted: optional_nested_message: { bb: 118 }\\n\"","Run()",
             (char (*) [47])"deleted: optional_nested_message: { bb: 118 }\n",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd61,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, EmbeddedFullDeletionTest) {
  proto2_.clear_optional_nested_message();

  EXPECT_EQ("deleted: optional_nested_message: { bb: 118 }\n", Run());
}